

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::LSTMWeightParams::LSTMWeightParams
          (LSTMWeightParams *this,LSTMWeightParams *from)

{
  bool bVar1;
  InternalMetadataWithArenaLite *this_00;
  WeightParams *pWVar2;
  LSTMWeightParams *from_local;
  LSTMWeightParams *this_local;
  Container *local_20;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__LSTMWeightParams_00d571b8;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  this->_cached_size_ = 0;
  this_00 = &from->_internal_metadata_;
  if (((uint)(this_00->
             super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
             ).ptr_ & 1) == 1) {
    if (((uint)(this_00->
               super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
               ).ptr_ & 1) == 1) {
      local_20 = google::protobuf::internal::
                 InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                 ::
                 PtrValue<google::protobuf::internal::InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>::Container>
                           ((InternalMetadataWithArenaBase<std::__cxx11::string,google::protobuf::internal::InternalMetadataWithArenaLite>
                             *)this_00);
    }
    else {
      local_20 = (Container *)
                 google::protobuf::internal::InternalMetadataWithArenaLite::
                 default_instance_abi_cxx11_();
    }
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,&local_20->unknown_fields);
  }
  bVar1 = has_inputgateweightmatrix(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->inputgateweightmatrix_);
    this->inputgateweightmatrix_ = pWVar2;
  }
  else {
    this->inputgateweightmatrix_ = (WeightParams *)0x0;
  }
  bVar1 = has_forgetgateweightmatrix(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->forgetgateweightmatrix_);
    this->forgetgateweightmatrix_ = pWVar2;
  }
  else {
    this->forgetgateweightmatrix_ = (WeightParams *)0x0;
  }
  bVar1 = has_blockinputweightmatrix(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->blockinputweightmatrix_);
    this->blockinputweightmatrix_ = pWVar2;
  }
  else {
    this->blockinputweightmatrix_ = (WeightParams *)0x0;
  }
  bVar1 = has_outputgateweightmatrix(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->outputgateweightmatrix_);
    this->outputgateweightmatrix_ = pWVar2;
  }
  else {
    this->outputgateweightmatrix_ = (WeightParams *)0x0;
  }
  bVar1 = has_inputgaterecursionmatrix(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->inputgaterecursionmatrix_);
    this->inputgaterecursionmatrix_ = pWVar2;
  }
  else {
    this->inputgaterecursionmatrix_ = (WeightParams *)0x0;
  }
  bVar1 = has_forgetgaterecursionmatrix(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->forgetgaterecursionmatrix_);
    this->forgetgaterecursionmatrix_ = pWVar2;
  }
  else {
    this->forgetgaterecursionmatrix_ = (WeightParams *)0x0;
  }
  bVar1 = has_blockinputrecursionmatrix(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->blockinputrecursionmatrix_);
    this->blockinputrecursionmatrix_ = pWVar2;
  }
  else {
    this->blockinputrecursionmatrix_ = (WeightParams *)0x0;
  }
  bVar1 = has_outputgaterecursionmatrix(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->outputgaterecursionmatrix_);
    this->outputgaterecursionmatrix_ = pWVar2;
  }
  else {
    this->outputgaterecursionmatrix_ = (WeightParams *)0x0;
  }
  bVar1 = has_inputgatebiasvector(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->inputgatebiasvector_);
    this->inputgatebiasvector_ = pWVar2;
  }
  else {
    this->inputgatebiasvector_ = (WeightParams *)0x0;
  }
  bVar1 = has_forgetgatebiasvector(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->forgetgatebiasvector_);
    this->forgetgatebiasvector_ = pWVar2;
  }
  else {
    this->forgetgatebiasvector_ = (WeightParams *)0x0;
  }
  bVar1 = has_blockinputbiasvector(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->blockinputbiasvector_);
    this->blockinputbiasvector_ = pWVar2;
  }
  else {
    this->blockinputbiasvector_ = (WeightParams *)0x0;
  }
  bVar1 = has_outputgatebiasvector(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->outputgatebiasvector_);
    this->outputgatebiasvector_ = pWVar2;
  }
  else {
    this->outputgatebiasvector_ = (WeightParams *)0x0;
  }
  bVar1 = has_inputgatepeepholevector(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->inputgatepeepholevector_);
    this->inputgatepeepholevector_ = pWVar2;
  }
  else {
    this->inputgatepeepholevector_ = (WeightParams *)0x0;
  }
  bVar1 = has_forgetgatepeepholevector(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->forgetgatepeepholevector_);
    this->forgetgatepeepholevector_ = pWVar2;
  }
  else {
    this->forgetgatepeepholevector_ = (WeightParams *)0x0;
  }
  bVar1 = has_outputgatepeepholevector(from);
  if (bVar1) {
    pWVar2 = (WeightParams *)operator_new(0x50);
    WeightParams::WeightParams(pWVar2,from->outputgatepeepholevector_);
    this->outputgatepeepholevector_ = pWVar2;
  }
  else {
    this->outputgatepeepholevector_ = (WeightParams *)0x0;
  }
  return;
}

Assistant:

LSTMWeightParams::LSTMWeightParams(const LSTMWeightParams& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  if (from.has_inputgateweightmatrix()) {
    inputgateweightmatrix_ = new ::CoreML::Specification::WeightParams(*from.inputgateweightmatrix_);
  } else {
    inputgateweightmatrix_ = NULL;
  }
  if (from.has_forgetgateweightmatrix()) {
    forgetgateweightmatrix_ = new ::CoreML::Specification::WeightParams(*from.forgetgateweightmatrix_);
  } else {
    forgetgateweightmatrix_ = NULL;
  }
  if (from.has_blockinputweightmatrix()) {
    blockinputweightmatrix_ = new ::CoreML::Specification::WeightParams(*from.blockinputweightmatrix_);
  } else {
    blockinputweightmatrix_ = NULL;
  }
  if (from.has_outputgateweightmatrix()) {
    outputgateweightmatrix_ = new ::CoreML::Specification::WeightParams(*from.outputgateweightmatrix_);
  } else {
    outputgateweightmatrix_ = NULL;
  }
  if (from.has_inputgaterecursionmatrix()) {
    inputgaterecursionmatrix_ = new ::CoreML::Specification::WeightParams(*from.inputgaterecursionmatrix_);
  } else {
    inputgaterecursionmatrix_ = NULL;
  }
  if (from.has_forgetgaterecursionmatrix()) {
    forgetgaterecursionmatrix_ = new ::CoreML::Specification::WeightParams(*from.forgetgaterecursionmatrix_);
  } else {
    forgetgaterecursionmatrix_ = NULL;
  }
  if (from.has_blockinputrecursionmatrix()) {
    blockinputrecursionmatrix_ = new ::CoreML::Specification::WeightParams(*from.blockinputrecursionmatrix_);
  } else {
    blockinputrecursionmatrix_ = NULL;
  }
  if (from.has_outputgaterecursionmatrix()) {
    outputgaterecursionmatrix_ = new ::CoreML::Specification::WeightParams(*from.outputgaterecursionmatrix_);
  } else {
    outputgaterecursionmatrix_ = NULL;
  }
  if (from.has_inputgatebiasvector()) {
    inputgatebiasvector_ = new ::CoreML::Specification::WeightParams(*from.inputgatebiasvector_);
  } else {
    inputgatebiasvector_ = NULL;
  }
  if (from.has_forgetgatebiasvector()) {
    forgetgatebiasvector_ = new ::CoreML::Specification::WeightParams(*from.forgetgatebiasvector_);
  } else {
    forgetgatebiasvector_ = NULL;
  }
  if (from.has_blockinputbiasvector()) {
    blockinputbiasvector_ = new ::CoreML::Specification::WeightParams(*from.blockinputbiasvector_);
  } else {
    blockinputbiasvector_ = NULL;
  }
  if (from.has_outputgatebiasvector()) {
    outputgatebiasvector_ = new ::CoreML::Specification::WeightParams(*from.outputgatebiasvector_);
  } else {
    outputgatebiasvector_ = NULL;
  }
  if (from.has_inputgatepeepholevector()) {
    inputgatepeepholevector_ = new ::CoreML::Specification::WeightParams(*from.inputgatepeepholevector_);
  } else {
    inputgatepeepholevector_ = NULL;
  }
  if (from.has_forgetgatepeepholevector()) {
    forgetgatepeepholevector_ = new ::CoreML::Specification::WeightParams(*from.forgetgatepeepholevector_);
  } else {
    forgetgatepeepholevector_ = NULL;
  }
  if (from.has_outputgatepeepholevector()) {
    outputgatepeepholevector_ = new ::CoreML::Specification::WeightParams(*from.outputgatepeepholevector_);
  } else {
    outputgatepeepholevector_ = NULL;
  }
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.LSTMWeightParams)
}